

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

void __thiscall QRhiGles2::dispatch(QRhiGles2 *this,QRhiCommandBuffer *cb,int x,int y,int z)

{
  const_iterator it_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  QRhiShaderResourceBinding *binding;
  Data *pDVar4;
  pair<int,_bool> *ppVar5;
  QRhiResource **ppQVar6;
  Command *pCVar7;
  float in_ECX;
  GLuint in_EDX;
  size_t in_RSI;
  float in_R8D;
  long in_FS_OFFSET;
  Command *cmd;
  Command *cmd_1;
  bool isNewInThisDispatch;
  int accessInThisDispatch;
  Data *b;
  int i;
  int bindingCount;
  QGles2ShaderResourceBindings *srbD;
  pair<int,_bool> *accessAndIsNewFlag;
  QHash<QRhiResource_*,_std::pair<int,_bool>_> *__range2;
  GLbitfield barriers;
  QGles2CommandBuffer *cbD;
  iterator it;
  iterator __end2;
  iterator __begin2;
  qsizetype in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  Type in_stack_ffffffffffffff14;
  iterator *in_stack_ffffffffffffff18;
  Command *in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  Type bindingType;
  int iVar8;
  uint local_a4;
  size_t sVar9;
  const_iterator local_78;
  piter local_68;
  piter local_58;
  piter local_48;
  bool local_35;
  int local_34;
  piter local_30;
  piter local_20;
  pair<int,_bool> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RSI + 0x118) != 0) {
    local_a4 = 0;
    local_20.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d = (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)
                 &DAT_aaaaaaaaaaaaaaaa;
    sVar9 = in_RSI;
    local_20 = (piter)QHash<QRhiResource_*,_std::pair<int,_bool>_>::begin
                                ((QHash<QRhiResource_*,_std::pair<int,_bool>_> *)
                                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    local_30.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_30.d = (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)
                 &DAT_aaaaaaaaaaaaaaaa;
    local_30 = (piter)QHash<QRhiResource_*,_std::pair<int,_bool>_>::end
                                ((QHash<QRhiResource_*,_std::pair<int,_bool>_> *)
                                 in_stack_ffffffffffffff18);
    while (bVar1 = QHash<QRhiResource_*,_std::pair<int,_bool>_>::iterator::operator!=
                             (in_stack_ffffffffffffff18,
                              (iterator *)
                              CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)), bVar1)
    {
      ppVar5 = QHash<QRhiResource_*,_std::pair<int,_bool>_>::iterator::operator*
                         ((iterator *)0x928dce);
      local_34 = 0;
      local_35 = false;
      std::pair<int,_bool>::pair<int,_bool,_true>(&local_10,&local_34,&local_35);
      std::pair<int,_bool>::operator=(ppVar5,&local_10);
      QHash<QRhiResource_*,_std::pair<int,_bool>_>::iterator::operator++
                ((iterator *)in_stack_ffffffffffffff20);
    }
    sVar3 = QVLABaseBase::size((QVLABaseBase *)(*(long *)(in_RSI + 0x118) + 0x30));
    iVar2 = (int)sVar3;
    for (iVar8 = 0; iVar8 < iVar2; iVar8 = iVar8 + 1) {
      binding = QVarLengthArray<QRhiShaderResourceBinding,_12LL>::at
                          ((QVarLengthArray<QRhiShaderResourceBinding,_12LL> *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff08);
      pDVar4 = QRhiImplementation::shaderResourceBindingData(binding);
      in_stack_ffffffffffffff14 = pDVar4->type;
      bindingType = (Type)((ulong)pDVar4 >> 0x20);
      if (in_stack_ffffffffffffff14 - ImageLoad < 3) {
        qrhigl_accumulateComputeResource<QHash<QRhiResource*,std::pair<int,bool>>>
                  ((QHash<QRhiResource_*,_std::pair<int,_bool>_> *)CONCAT44(iVar2,iVar8),
                   (QRhiResource *)CONCAT44(in_EDX,in_ECX),bindingType,(int)pDVar4,
                   in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
      }
      else if (in_stack_ffffffffffffff14 - BufferLoad < 3) {
        qrhigl_accumulateComputeResource<QHash<QRhiResource*,std::pair<int,bool>>>
                  ((QHash<QRhiResource_*,_std::pair<int,_bool>_> *)CONCAT44(iVar2,iVar8),
                   (QRhiResource *)CONCAT44(in_EDX,in_ECX),bindingType,(int)pDVar4,
                   in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
      }
    }
    local_48.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)
                 &DAT_aaaaaaaaaaaaaaaa;
    local_48 = (piter)QHash<QRhiResource_*,_std::pair<int,_bool>_>::begin
                                ((QHash<QRhiResource_*,_std::pair<int,_bool>_> *)
                                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    while( true ) {
      local_58 = (piter)QHash<QRhiResource_*,_std::pair<int,_bool>_>::end
                                  ((QHash<QRhiResource_*,_std::pair<int,_bool>_> *)
                                   in_stack_ffffffffffffff18);
      bVar1 = QHash<QRhiResource_*,_std::pair<int,_bool>_>::iterator::operator!=
                        (in_stack_ffffffffffffff18,
                         (iterator *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      if (!bVar1) break;
      ppVar5 = QHash<QRhiResource_*,_std::pair<int,_bool>_>::iterator::operator->
                         ((iterator *)0x928fad);
      iVar2 = ppVar5->first;
      ppVar5 = QHash<QRhiResource_*,_std::pair<int,_bool>_>::iterator::operator->
                         ((iterator *)0x928fc0);
      in_stack_ffffffffffffff28 =
           CONCAT13(ppVar5->second,(int3)in_stack_ffffffffffffff28) & 0x1ffffff;
      if ((iVar2 != 0) && ((char)(in_stack_ffffffffffffff28 >> 0x18) == '\0')) {
        ppQVar6 = QHash<QRhiResource_*,_std::pair<int,_bool>_>::iterator::key((iterator *)0x928fe4);
        iVar8 = (*(*ppQVar6)->_vptr_QRhiResource[2])();
        if (iVar8 == 1) {
          local_a4 = local_a4 | 0x20;
        }
        else {
          local_a4 = local_a4 | 0x2000;
        }
      }
      if (iVar2 == 1) {
        QHash<QRhiResource_*,_std::pair<int,_bool>_>::const_iterator::const_iterator
                  (&local_78,(iterator *)&local_48);
        it_00.i.d._4_4_ = in_EDX;
        it_00.i.d._0_4_ = in_ECX;
        it_00.i.bucket = sVar9;
        local_68 = (piter)QHash<QRhiResource_*,_std::pair<int,_bool>_>::erase
                                    ((QHash<QRhiResource_*,_std::pair<int,_bool>_> *)
                                     CONCAT44(iVar2,in_stack_ffffffffffffff28),it_00);
        local_48 = local_68;
      }
      else {
        QHash<QRhiResource_*,_std::pair<int,_bool>_>::iterator::operator++
                  ((iterator *)in_stack_ffffffffffffff20);
      }
    }
    if (local_a4 != 0) {
      in_stack_ffffffffffffff20 =
           QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get
                     ((QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024> *)
                      &DAT_aaaaaaaaaaaaaaaa);
      in_stack_ffffffffffffff20->cmd = Barrier;
      (in_stack_ffffffffffffff20->args).stencilRef.ref = local_a4;
    }
  }
  pCVar7 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get
                     ((QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024> *)
                      in_stack_ffffffffffffff20);
  pCVar7->cmd = Dispatch;
  (pCVar7->args).beginFrame.timestampQuery = in_EDX;
  (pCVar7->args).viewport.y = in_ECX;
  (pCVar7->args).viewport.w = in_R8D;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRhiGles2::dispatch(QRhiCommandBuffer *cb, int x, int y, int z)
{
    QGles2CommandBuffer *cbD = QRHI_RES(QGles2CommandBuffer, cb);
    Q_ASSERT(cbD->recordingPass == QGles2CommandBuffer::ComputePass);

    if (cbD->currentComputeSrb) {
        GLbitfield barriers = 0;

        // The key in the writtenResources map indicates that the resource was
        // written in a previous dispatch, whereas the value accumulates the
        // access mask in the current one.
        for (auto &accessAndIsNewFlag : cbD->computePassState.writtenResources)
            accessAndIsNewFlag = { 0, false };

        QGles2ShaderResourceBindings *srbD = QRHI_RES(QGles2ShaderResourceBindings, cbD->currentComputeSrb);
        const int bindingCount = srbD->m_bindings.size();
        for (int i = 0; i < bindingCount; ++i) {
            const QRhiShaderResourceBinding::Data *b = shaderResourceBindingData(srbD->m_bindings.at(i));
            switch (b->type) {
            case QRhiShaderResourceBinding::ImageLoad:
            case QRhiShaderResourceBinding::ImageStore:
            case QRhiShaderResourceBinding::ImageLoadStore:
                qrhigl_accumulateComputeResource(&cbD->computePassState.writtenResources,
                                                 b->u.simage.tex,
                                                 b->type,
                                                 QRhiShaderResourceBinding::ImageLoad,
                                                 QRhiShaderResourceBinding::ImageStore,
                                                 QRhiShaderResourceBinding::ImageLoadStore);
                break;
            case QRhiShaderResourceBinding::BufferLoad:
            case QRhiShaderResourceBinding::BufferStore:
            case QRhiShaderResourceBinding::BufferLoadStore:
                qrhigl_accumulateComputeResource(&cbD->computePassState.writtenResources,
                                                 b->u.sbuf.buf,
                                                 b->type,
                                                 QRhiShaderResourceBinding::BufferLoad,
                                                 QRhiShaderResourceBinding::BufferStore,
                                                 QRhiShaderResourceBinding::BufferLoadStore);
                break;
            default:
                break;
            }
        }

        for (auto it = cbD->computePassState.writtenResources.begin(); it != cbD->computePassState.writtenResources.end(); ) {
            const int accessInThisDispatch = it->first;
            const bool isNewInThisDispatch = it->second;
            if (accessInThisDispatch && !isNewInThisDispatch) {
                if (it.key()->resourceType() == QRhiResource::Texture)
                    barriers |= GL_SHADER_IMAGE_ACCESS_BARRIER_BIT;
                else
                    barriers |= GL_SHADER_STORAGE_BARRIER_BIT;
            }
            // Anything that was previously written, but is only read now, can be
            // removed from the written list (because that previous write got a
            // corresponding barrier now).
            if (accessInThisDispatch == QGles2CommandBuffer::ComputePassState::Read)
                it = cbD->computePassState.writtenResources.erase(it);
            else
                ++it;
        }

        if (barriers) {
            QGles2CommandBuffer::Command &cmd(cbD->commands.get());
            cmd.cmd = QGles2CommandBuffer::Command::Barrier;
            cmd.args.barrier.barriers = barriers;
        }
    }

    QGles2CommandBuffer::Command &cmd(cbD->commands.get());
    cmd.cmd = QGles2CommandBuffer::Command::Dispatch;
    cmd.args.dispatch.x = GLuint(x);
    cmd.args.dispatch.y = GLuint(y);
    cmd.args.dispatch.z = GLuint(z);
}